

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O2

void __thiscall NJamSpell::TBloomFilter::TBloomFilter(TBloomFilter *this)

{
  _Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false> _Var1;
  
  (this->BloomFilter)._M_t.
  super___uniq_ptr_impl<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_NJamSpell::TBloomFilter::Impl_*,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
  .super__Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false>._M_head_impl = (Impl *)0x0;
  _Var1._M_head_impl = (Impl *)operator_new(0x68);
  *(pointer *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x28) = (pointer)0x0;
  *(pointer *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x30) = (pointer)0x0;
  *(pointer *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x18) = (pointer)0x0;
  *(undefined8 *)
   &((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
    ((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x20))->
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> = 0;
  *(undefined8 *)
   &((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
    ((long)&(_Var1._M_head_impl)->super_bloom_filter + 8))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> = 0;
  *(pointer *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x10) = (pointer)0x0;
  *(uint *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x38) = 0;
  *(unsigned_long_long *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x40) = 0;
  *(unsigned_long_long *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x48) = 0;
  *(unsigned_long_long *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x50) = 0;
  *(unsigned_long_long *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x58) = 0;
  *(double *)((long)&(_Var1._M_head_impl)->super_bloom_filter + 0x60) = 0.0;
  ((_Var1._M_head_impl)->super_bloom_filter)._vptr_bloom_filter = &PTR__bloom_filter_0014bb50;
  (this->BloomFilter)._M_t.
  super___uniq_ptr_impl<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_NJamSpell::TBloomFilter::Impl_*,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
  .super__Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false>._M_head_impl = _Var1._M_head_impl;
  return;
}

Assistant:

TBloomFilter::TBloomFilter() {
    BloomFilter.reset(new TBloomFilter::Impl());
}